

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_ds.h
# Opt level: O3

void * stbds_hmget_key_ts(void *a,size_t elemsize,void *key,size_t keysize,ptrdiff_t *temp,int mode)

{
  long lVar1;
  ulong uVar2;
  undefined8 *puVar3;
  ptrdiff_t pVar4;
  
  if (a == (void *)0x0) {
    puVar3 = (undefined8 *)malloc(elemsize * 4 + 0x20);
    puVar3[2] = 0;
    puVar3[3] = 0;
    puVar3[1] = 4;
    *puVar3 = 1;
    memset(puVar3 + 4,0,elemsize);
    *temp = -1;
    a = (void *)((long)puVar3 + elemsize + 0x20);
  }
  else {
    lVar1 = *(long *)((long)a + (-0x10 - elemsize));
    pVar4 = -1;
    if (lVar1 != 0) {
      uVar2 = stbds_hm_find_slot(a,elemsize,key,keysize,0,mode);
      if (-1 < (long)uVar2) {
        pVar4 = *(ptrdiff_t *)
                 ((uVar2 & 0xffffffffffffff8) * 0x10 + *(long *)(lVar1 + 0x60) + 0x40 +
                 (ulong)((uint)uVar2 & 7) * 8);
      }
    }
    *temp = pVar4;
  }
  return a;
}

Assistant:

void * stbds_hmget_key_ts(void *a, size_t elemsize, void *key, size_t keysize, ptrdiff_t *temp, int mode)
{
  size_t keyoffset = 0;
  if (a == NULL) {
    // make it non-empty so we can return a temp
    a = stbds_arrgrowf(0, elemsize, 0, 1);
    stbds_header(a)->length += 1;
    memset(a, 0, elemsize);
    *temp = STBDS_INDEX_EMPTY;
    // adjust a to point after the default element
    return STBDS_ARR_TO_HASH(a,elemsize);
  } else {
    stbds_hash_index *table;
    void *raw_a = STBDS_HASH_TO_ARR(a,elemsize);
    // adjust a to point to the default element
    table = (stbds_hash_index *) stbds_header(raw_a)->hash_table;
    if (table == 0) {
      *temp = -1;
    } else {
      ptrdiff_t slot = stbds_hm_find_slot(a, elemsize, key, keysize, keyoffset, mode);
      if (slot < 0) {
        *temp = STBDS_INDEX_EMPTY;
      } else {
        stbds_hash_bucket *b = &table->storage[slot >> STBDS_BUCKET_SHIFT];
        *temp = b->index[slot & STBDS_BUCKET_MASK];
      }
    }
    return a;
  }
}